

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

Variant * __thiscall Jinx::Impl::Parser::ParseValue(Variant *__return_storage_ptr__,Parser *this)

{
  pointer pSVar1;
  bool local_35;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_20;
  Parser *local_18;
  Parser *this_local;
  Variant *val;
  
  local_35 = true;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  if ((this->m_error & 1U) == 0) {
    local_20._M_current =
         (Symbol *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    local_35 = __gnu_cxx::operator==(&this->m_currentSymbol,&local_20);
  }
  if (local_35 == false) {
    Jinx::Variant::Variant(__return_storage_ptr__);
    pSVar1 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    switch(pSVar1->type) {
    case StringValue:
      pSVar1 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      Jinx::Variant::SetString(__return_storage_ptr__,&pSVar1->text);
      break;
    case NumberValue:
      pSVar1 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      Jinx::Variant::SetNumber(__return_storage_ptr__,(pSVar1->field_2).numVal);
      break;
    case IntegerValue:
      pSVar1 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      Jinx::Variant::SetInteger(__return_storage_ptr__,(pSVar1->field_2).intVal);
      break;
    case BooleanValue:
      pSVar1 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      Jinx::Variant::SetBoolean(__return_storage_ptr__,(bool)((pSVar1->field_2).boolVal & 1));
      break;
    default:
      Error<>(this,"Unknown value");
      break;
    case Null:
    }
    NextSymbol(this);
  }
  else {
    Jinx::Variant::Variant(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant Parser::ParseValue()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return Variant();
		Variant val;
		switch (m_currentSymbol->type)
		{
		case SymbolType::NumberValue:
			val.SetNumber(m_currentSymbol->numVal);
			break;
		case SymbolType::IntegerValue:
			val.SetInteger(m_currentSymbol->intVal);
			break;
		case SymbolType::BooleanValue:
			val.SetBoolean(m_currentSymbol->boolVal);
			break;
		case SymbolType::StringValue:
			val.SetString(m_currentSymbol->text);
			break;
		case SymbolType::Null:
			break;
		default:
			Error("Unknown value");
		}
		NextSymbol();
		return val;
	}